

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eccommit_impl.h
# Opt level: O0

int secp256k1_ec_commit_tweak
              (uchar *tweak32,secp256k1_ge *pubp,secp256k1_sha256 *sha,uchar *data,size_t data_size)

{
  int iVar1;
  uchar local_68 [8];
  uchar rbuf [33];
  size_t data_size_local;
  uchar *data_local;
  secp256k1_sha256 *sha_local;
  secp256k1_ge *pubp_local;
  uchar *tweak32_local;
  
  iVar1 = secp256k1_ec_commit_pubkey_serialize_const(pubp,local_68);
  if (iVar1 != 0) {
    secp256k1_sha256_write(sha,local_68,0x21);
    secp256k1_sha256_write(sha,data,data_size);
    secp256k1_sha256_finalize(sha,tweak32);
  }
  tweak32_local._4_4_ = (uint)(iVar1 != 0);
  return tweak32_local._4_4_;
}

Assistant:

static int secp256k1_ec_commit_tweak(unsigned char *tweak32, secp256k1_ge* pubp, secp256k1_sha256* sha, const unsigned char *data, size_t data_size)
{
    unsigned char rbuf[33];

    if (!secp256k1_ec_commit_pubkey_serialize_const(pubp, rbuf)) {
        return 0;
    }
    secp256k1_sha256_write(sha, rbuf, sizeof(rbuf));
    secp256k1_sha256_write(sha, data, data_size);
    secp256k1_sha256_finalize(sha, tweak32);
    return 1;
}